

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall FindInterval_Basics_Test::~FindInterval_Basics_Test(FindInterval_Basics_Test *this)

{
  void *in_RDI;
  
  ~FindInterval_Basics_Test((FindInterval_Basics_Test *)0x6085b8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(FindInterval, Basics) {
    std::vector<float> a{0, 1, 2, 3, 4, 5, 6, 7, 8, 9};

    // Check clamping for out of range
    EXPECT_EQ(0, FindInterval(a.size(), [&](int index) { return a[index] <= -1; }));
    EXPECT_EQ(a.size() - 2,
              FindInterval(a.size(), [&](int index) { return a[index] <= 100; }));

    for (size_t i = 0; i < a.size() - 1; ++i) {
        EXPECT_EQ(i, FindInterval(a.size(), [&](int index) { return a[index] <= i; }));
        EXPECT_EQ(i,
                  FindInterval(a.size(), [&](int index) { return a[index] <= i + 0.5; }));
        if (i > 0)
            EXPECT_EQ(i - 1, FindInterval(a.size(), [&](int index) {
                          return a[index] <= i - 0.5;
                      }));
    }
}